

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FilePath *in_RDI;
  FilePath result;
  FilePath local_50;
  FilePath local_30;
  
  paVar1 = &local_50.pathname_.field_2;
  local_50.pathname_._M_string_length = 0;
  local_50.pathname_.field_2._M_local_buf[0] = '\0';
  local_50.pathname_._M_dataplus._M_p = (pointer)paVar1;
  FilePath::FilePath(&local_30,(string *)g_executable_path_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.pathname_._M_dataplus._M_p != &local_30.pathname_.field_2) {
    operator_delete(local_30.pathname_._M_dataplus._M_p,
                    local_30.pathname_.field_2._M_allocated_capacity + 1);
  }
  FilePath::RemoveDirectoryName(in_RDI,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.pathname_._M_dataplus._M_p,
                    CONCAT71(local_50.pathname_.field_2._M_allocated_capacity._1_7_,
                             local_50.pathname_.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(g_executable_path).RemoveExtension("exe"));
#else
  result.Set(FilePath(g_executable_path));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}